

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_plus.c
# Opt level: O0

MPP_RET hal_avsd_plus_reset(void *decoder)

{
  AvsdHalCtx_t *p_hal;
  MPP_RET ret;
  void *decoder_local;
  
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","In.","hal_avsd_plus_reset");
  }
  *(undefined4 *)((long)decoder + 0x1fc) = 1;
  *(undefined4 *)((long)decoder + 0x200) = 0;
  memset((void *)((long)decoder + 0x1c0),0,0x3c);
  *(undefined4 *)((long)decoder + 0x214) = 0xffffffff;
  *(undefined4 *)((long)decoder + 0x20c) = 0xffffffff;
  *(undefined4 *)((long)decoder + 0x210) = 0xffffffff;
  if ((avsd_hal_debug & 8) != 0) {
    _mpp_log_l(4,"hal_avsd_plus","Out.","hal_avsd_plus_reset");
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_avsd_plus_reset(void *decoder)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    AVSD_HAL_TRACE("In.");

    p_hal->first_field = 1;
    p_hal->prev_pic_structure = 0; //!< field

    memset(p_hal->pic, 0, sizeof(p_hal->pic));
    p_hal->work_out = -1;
    p_hal->work0 = -1;
    p_hal->work1 = -1;

    AVSD_HAL_TRACE("Out.");

    return ret = MPP_OK;
}